

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

size_t google::protobuf::internal::WireFormat::FieldByteSize
                 (FieldDescriptor *field,Message *message)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  MapFieldBase *this;
  size_t sVar6;
  Reflection *this_00;
  ulong uVar7;
  Metadata MVar8;
  
  MVar8 = Message::GetMetadata(message);
  this_00 = MVar8.reflection;
  bVar1 = field->field_0x1;
  if ((((bVar1 & 8) != 0) &&
      ((field->containing_type_->options_->field_0)._impl_.message_set_wire_format_ == true)) &&
     (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10)) {
    if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) goto LAB_00fde8a1;
    if ((bVar1 & 0x20) == 0) {
      sVar6 = MessageSetItemByteSize(field,message);
      return sVar6;
    }
  }
  if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
    FieldByteSize();
LAB_00fde8a1:
    FieldByteSize();
  }
  if ((bVar1 & 0x20) == 0) {
    uVar7 = 1;
    if ((field->containing_type_->options_->field_0)._impl_.map_entry_ == false) {
      bVar4 = Reflection::HasField(this_00,message,field);
      uVar7 = (ulong)bVar4;
    }
    goto LAB_00fde7f0;
  }
  if (field->type_ == '\v') {
    bVar4 = FieldDescriptor::is_map_message_type(field);
    if (!bVar4) goto LAB_00fde7df;
    this = Reflection::GetMapData(this_00,message,field);
    bVar4 = MapFieldBase::IsMapValid(this);
    if (!bVar4) goto LAB_00fde7df;
    uVar5 = MapFieldBase::size(this);
  }
  else {
LAB_00fde7df:
    uVar5 = Reflection::FieldSize(this_00,message,field);
  }
  uVar7 = (ulong)uVar5;
LAB_00fde7f0:
  sVar6 = FieldDataOnlyByteSize(field,message);
  bVar4 = FieldDescriptor::is_packed(field);
  if (bVar4) {
    if (sVar6 == 0) {
      sVar6 = 0;
    }
    else {
      uVar5 = field->number_ * 8 + 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar5 = (uint)sVar6 | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = (iVar3 * 9 + 0x49U >> 6) + sVar6 + (ulong)(iVar2 * 9 + 0x49U >> 6);
    }
  }
  else {
    uVar5 = field->number_ * 8 + 1;
    iVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar6 = ((ulong)(iVar2 * 9 + 0x49U >> 6) << (field->type_ == '\n')) * uVar7 + sVar6;
  }
  return sVar6;
}

Assistant:

size_t WireFormat::FieldByteSize(const FieldDescriptor* field,
                                 const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    return MessageSetItemByteSize(field, message);
  }

  size_t count = 0;
  if (field->is_repeated()) {
    if (field->is_map()) {
      const MapFieldBase* map_field =
          message_reflection->GetMapData(message, field);
      if (map_field->IsMapValid()) {
        count = FromIntSize(map_field->size());
      } else {
        count = FromIntSize(message_reflection->FieldSize(message, field));
      }
    } else {
      count = FromIntSize(message_reflection->FieldSize(message, field));
    }
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  const size_t data_size = FieldDataOnlyByteSize(field, message);
  size_t our_size = data_size;
  if (field->is_packed()) {
    if (data_size > 0) {
      // Packed fields get serialized like a string, not their native type.
      // Technically this doesn't really matter; the size only changes if it's
      // a GROUP
      our_size += TagSize(field->number(), FieldDescriptor::TYPE_STRING);
      our_size += io::CodedOutputStream::VarintSize32(data_size);
    }
  } else {
    our_size += count * TagSize(field->number(), field->type());
  }
  return our_size;
}